

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.cpp
# Opt level: O0

bool lunasvg::parseUrlValue(string_view *input,string *value)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  const_reference pvVar4;
  bool local_47;
  byte local_32;
  undefined1 local_30 [7];
  value_type delim;
  string *local_20;
  string *value_local;
  string_view *input_local;
  
  local_20 = value;
  value_local = (string *)input;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_30,"url");
  bVar2 = skipString(input,(string_view *)local_30);
  local_32 = 1;
  if (bVar2) {
    bVar2 = skipOptionalSpaces((string_view *)value_local);
    local_32 = 1;
    if (bVar2) {
      bVar2 = skipDelimiter((string_view *)value_local,'(');
      local_32 = 1;
      if (bVar2) {
        bVar2 = skipOptionalSpaces((string_view *)value_local);
        local_32 = bVar2 ^ 0xff;
      }
    }
  }
  if ((local_32 & 1) != 0) {
    return false;
  }
  pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::front
                     ((basic_string_view<char,_std::char_traits<char>_> *)value_local);
  cVar1 = *pvVar4;
  if (cVar1 != '\"') {
    if (cVar1 == '#') {
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)value_local,1);
      while( true ) {
        bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)value_local);
        bVar2 = false;
        if (!bVar3) {
          pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::front
                             ((basic_string_view<char,_std::char_traits<char>_> *)value_local);
          bVar2 = *pvVar4 != ')';
        }
        if (!bVar2) break;
        pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::front
                           ((basic_string_view<char,_std::char_traits<char>_> *)value_local);
        std::__cxx11::string::operator+=((string *)local_20,*pvVar4);
        std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                  ((basic_string_view<char,_std::char_traits<char>_> *)value_local,1);
      }
      goto LAB_0013221c;
    }
    if (cVar1 != '\'') {
      return false;
    }
  }
  pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::front
                     ((basic_string_view<char,_std::char_traits<char>_> *)value_local);
  cVar1 = *pvVar4;
  std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
            ((basic_string_view<char,_std::char_traits<char>_> *)value_local,1);
  skipOptionalSpaces((string_view *)value_local);
  bVar2 = skipDelimiter((string_view *)value_local,'#');
  if (!bVar2) {
    return false;
  }
  while( true ) {
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)value_local);
    bVar2 = false;
    if (!bVar3) {
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::front
                         ((basic_string_view<char,_std::char_traits<char>_> *)value_local);
      bVar2 = *pvVar4 != cVar1;
    }
    if (!bVar2) break;
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::front
                       ((basic_string_view<char,_std::char_traits<char>_> *)value_local);
    std::__cxx11::string::operator+=((string *)local_20,*pvVar4);
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)value_local,1);
  }
  skipOptionalSpaces((string_view *)value_local);
  bVar2 = skipDelimiter((string_view *)value_local,cVar1);
  if (!bVar2) {
    return false;
  }
LAB_0013221c:
  bVar2 = skipOptionalSpaces((string_view *)value_local);
  local_47 = false;
  if (bVar2) {
    local_47 = skipDelimiter((string_view *)value_local,')');
  }
  return local_47;
}

Assistant:

static bool parseUrlValue(std::string_view& input, std::string& value)
{
    if(!skipString(input, "url")
        || !skipOptionalSpaces(input)
        || !skipDelimiter(input, '(')
        || !skipOptionalSpaces(input)) {
        return false;
    }

    switch(input.front()) {
    case '\'':
    case '\"': {
        auto delim = input.front();
        input.remove_prefix(1);
        skipOptionalSpaces(input);
        if(!skipDelimiter(input, '#'))
            return false;
        while(!input.empty() && input.front() != delim) {
            value += input.front();
            input.remove_prefix(1);
        }

        skipOptionalSpaces(input);
        if(!skipDelimiter(input, delim))
            return false;
        break;
    } case '#': {
        input.remove_prefix(1);
        while(!input.empty() && input.front() != ')') {
            value += input.front();
            input.remove_prefix(1);
        }

        break;
    } default:
        return false;
    }

    return skipOptionalSpaces(input) && skipDelimiter(input, ')');
}